

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_sig.c
# Opt level: O0

err_t cmdSigExtr(char *obj_name,char *sig_name,char *scope)

{
  bool_t bVar1;
  int iVar2;
  u32 uVar3;
  blob_t pvVar4;
  size_t sVar5;
  char *name;
  char *in_RDX;
  char *in_RSI;
  size_t size_1;
  size_t size;
  size_t pos;
  size_t cert_len;
  octet *cert;
  size_t certs_len;
  size_t num;
  size_t sig_len;
  cmd_sig_t *sig;
  void *stack;
  err_t code;
  octet *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  ulong count;
  size_t *in_stack_ffffffffffffffa0;
  void *buf;
  cmd_sig_t *in_stack_ffffffffffffffa8;
  long local_50;
  size_t local_40;
  blob_t count_00;
  undefined4 in_stack_ffffffffffffffd8;
  err_t local_4;
  
  bVar1 = strIsValid(in_stack_ffffffffffffff90);
  if (((bVar1 == 0) || (bVar1 = strIsValid(in_stack_ffffffffffffff90), bVar1 == 0)) ||
     (bVar1 = strIsValid(in_stack_ffffffffffffff90), bVar1 == 0)) {
    local_4 = 0x6d;
  }
  else {
    iVar2 = strCmp(in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88);
    if (((iVar2 == 0) ||
        (iVar2 = strCmp(in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88), iVar2 == 0))
       || (bVar1 = strStartsWith(in_RDX,"cert"), bVar1 != 0)) {
      pvVar4 = blobCreate((size_t)in_stack_ffffffffffffff88);
      local_4 = 0x6e;
      if (pvVar4 != (blob_t)0x0) {
        local_4 = 0;
      }
      if (local_4 == 0) {
        count_00 = pvVar4;
        local_4 = cmdSigRead(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                             in_stack_ffffffffffffff98);
        if (local_4 == 0) {
          bVar1 = strStartsWith(in_RDX,"cert");
          if (bVar1 == 0) {
            iVar2 = strCmp(in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88);
            if (iVar2 == 0) {
              sVar5 = cmdFileSize((char *)in_stack_ffffffffffffffa8);
              if (sVar5 == 0xffffffffffffffff) {
                local_4 = 0xcf;
              }
              else if (sVar5 == local_40) {
                local_4 = 0x132;
              }
              else {
                local_4 = cmdFileDup(in_RSI,in_RDX,CONCAT44(local_4,in_stack_ffffffffffffffd8),
                                     (size_t)count_00);
              }
            }
            else {
              sVar5 = cmdFileSize((char *)in_stack_ffffffffffffffa8);
              if (sVar5 == 0xffffffffffffffff) {
                local_4 = 0xcf;
              }
              else {
                local_4 = cmdFileDup(in_RSI,in_RDX,CONCAT44(local_4,in_stack_ffffffffffffffd8),
                                     (size_t)count_00);
              }
            }
          }
          else {
            sVar5 = strLen((char *)0x10a90a);
            in_RDX = in_RDX + sVar5;
            bVar1 = decIsValid((char *)in_stack_ffffffffffffff88);
            if ((bVar1 == 0) || (sVar5 = strLen((char *)0x10a92d), sVar5 != 1)) {
              local_4 = 0x25b;
            }
            if (local_4 != 0) {
              blobClose((blob_t)0x10a94c);
              return local_4;
            }
            uVar3 = decToU32(in_RDX);
            local_50 = *(long *)((long)pvVar4 + 0x620);
            name = (char *)((long)pvVar4 + 0x68);
            count = 0;
            buf = (void *)0x0;
            while (((local_50 != 0 &&
                    (buf = (void *)btokCVCLen(in_stack_ffffffffffffff88,0x10a9b2),
                    buf != (void *)0xffffffffffffffff)) && (count != uVar3))) {
              local_50 = local_50 - (long)buf;
              name = (char *)((long)buf + (long)name);
              count = count + 1;
            }
            if (((count == uVar3) && (buf != (void *)0x0)) && (buf != (void *)0xffffffffffffffff)) {
              local_4 = cmdFileWrite(name,buf,count);
            }
            else {
              local_4 = 0x202;
            }
          }
          blobClose((blob_t)0x10ab01);
        }
        else {
          blobClose((blob_t)0x10a8d7);
        }
      }
    }
    else {
      local_4 = 0x25b;
    }
  }
  return local_4;
}

Assistant:

err_t cmdSigExtr(const char* obj_name, const char* sig_name, const char* scope)
{
	err_t code;
	void* stack;
	cmd_sig_t* sig;
	size_t sig_len;
	// входной контроль
	if (!strIsValid(sig_name) || !strIsValid(obj_name) || !strIsValid(scope))
		return ERR_BAD_INPUT;
	if (!strEq(scope, "body") &&
		!strEq(scope, "sig") &&
		!strStartsWith(scope, "cert"))
		return ERR_CMD_PARAMS;
	// выделить и разметить память
	code = cmdBlobCreate(stack, sizeof(cmd_sig_t));
	ERR_CALL_CHECK(code);
	sig = (cmd_sig_t*)stack;
	// читать подпись
	code = cmdSigRead(sig, &sig_len, sig_name);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// извлечь сертификат?
	if (strStartsWith(scope, "cert"))
	{
		size_t num;
		size_t certs_len;
		const octet* cert;
		size_t cert_len;
		size_t pos;
		// определить номер сертификата
		scope += strLen("cert");
		if (!decIsValid(scope) || strLen(scope) != 1)
			code = ERR_CMD_PARAMS;
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		num = decToU32(scope);
		// искать сертификат
		certs_len = sig->certs_len, cert = sig->certs, cert_len = pos = 0;
		while (certs_len)
		{
			cert_len = btokCVCLen(cert, certs_len);
			if (cert_len == SIZE_MAX || pos == num)
				break;
			certs_len -= cert_len, cert += cert_len, ++pos;
		}
		// найден? записать в файл
		if (pos == num && cert_len != 0 && cert_len != SIZE_MAX)
			code = cmdFileWrite(obj_name, cert, cert_len);
		else
			code = ERR_BAD_CERT;
	}
	else if (strEq(scope, "body"))
	{
		size_t size = cmdFileSize(sig_name);
		if (size == SIZE_MAX)
			code = ERR_FILE_READ;
		else if (size == sig_len)
			code = ERR_BAD_FORMAT;
		else
			code = cmdFileDup(obj_name, sig_name, 0, size - sig_len);
	}
	else
	{
		size_t size = cmdFileSize(sig_name);
		if (size == SIZE_MAX)
			code = ERR_FILE_READ;
		else
			code = cmdFileDup(obj_name, sig_name, size - sig_len, sig_len);
	}
	// завершить
	cmdBlobClose(stack);
	return code;
}